

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# information_flow.c
# Opt level: O0

double mutual_info(int *src,int *dst,size_t l_src,size_t l_dst,size_t n,size_t m,int b,
                  inform_error *err)

{
  _Bool _Var1;
  int local_80;
  int local_7c;
  int *local_78;
  double mi;
  size_t i_1;
  ulong uStack_60;
  int b_dst;
  size_t i;
  int *piStack_50;
  int b_src;
  int *data;
  size_t N;
  size_t m_local;
  size_t n_local;
  size_t l_dst_local;
  size_t l_src_local;
  int *dst_local;
  int *src_local;
  
  data = (int *)(n * m);
  N = m;
  m_local = n;
  n_local = l_dst;
  l_dst_local = l_src;
  l_src_local = (size_t)dst;
  dst_local = src;
  piStack_50 = (int *)malloc(((long)data * 2 + l_src + l_dst) * 4);
  if (piStack_50 == (int *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
    src_local = (int *)0x7ff8000000000000;
  }
  else {
    i._4_4_ = 1;
    for (uStack_60 = 0; uStack_60 < l_dst_local; uStack_60 = uStack_60 + 1) {
      i._4_4_ = b * i._4_4_;
      piStack_50[(long)data * 2 + uStack_60] = b;
    }
    i_1._4_4_ = 1;
    for (mi = 0.0; (ulong)mi < n_local; mi = (double)((long)mi + 1)) {
      i_1._4_4_ = b * i_1._4_4_;
      piStack_50[(long)data * 2 + l_dst_local + (long)mi] = b;
    }
    inform_black_box(dst_local,l_dst_local,m_local,N,piStack_50 + (long)data * 2,(size_t *)0x0,
                     (size_t *)0x0,piStack_50,err);
    _Var1 = inform_failed(err);
    if (_Var1) {
      src_local = (int *)0x7ff8000000000000;
    }
    else {
      inform_black_box((int *)l_src_local,n_local,m_local,N,
                       piStack_50 + (long)data * 2 + l_dst_local,(size_t *)0x0,(size_t *)0x0,
                       piStack_50 + (long)data,err);
      _Var1 = inform_failed(err);
      if (_Var1) {
        src_local = (int *)0x7ff8000000000000;
      }
      else {
        local_80 = i._4_4_;
        local_7c = i_1._4_4_;
        local_78 = (int *)inform_mutual_info(piStack_50,2,(size_t)data,&local_80,err);
        free(piStack_50);
        src_local = local_78;
      }
    }
  }
  return (double)src_local;
}

Assistant:

static double mutual_info(int const *src, int const *dst, size_t l_src,
    size_t l_dst, size_t n, size_t m, int b, inform_error *err)
{
    size_t const N = n * m;

    int *data = malloc((2 * N + l_src + l_dst) * sizeof(int));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    int b_src = 1;
    for (size_t i = 0; i < l_src; ++i)
    {
        b_src *= b;
        data[2 * N + i] = b;
    }

    int b_dst = 1;
    for (size_t i = 0; i < l_dst; ++i)
    {
        b_dst *= b;
        data[2 * N + l_src + i] = b;
    }

    inform_black_box(src, l_src, n, m, data + 2 * N, NULL, NULL, data, err);
    if (inform_failed(err))
    {
        return NAN;
    }

    inform_black_box(dst, l_dst, n, m, data + 2 * N + l_src, NULL, NULL, data + N, err);
    if (inform_failed(err))
    {
        return NAN;
    }

    double mi = inform_mutual_info(data, 2, N, (int[2]){ b_src, b_dst }, err);

    free(data);

    return mi;
}